

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::traverseRedefine(TraverseSchema *this,DOMElement *redefineElem)

{
  SchemaInfo *pSVar1;
  RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *pRVar2;
  SchemaInfo *pSVar3;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_30;
  
  pSVar1 = this->fSchemaInfo;
  if (redefineElem == (DOMElement *)0x0) {
    local_30.fScopeAdded = false;
    pSVar3 = pSVar1;
  }
  else {
    local_30.fScopeAdded = retrieveNamespaceMapping(this,redefineElem);
    pSVar3 = this->fSchemaInfo;
  }
  pRVar2 = this->fPreprocessedNodes->fBucketList
           [(ulong)redefineElem % this->fPreprocessedNodes->fHashModulus];
  do {
    local_30.fSchemaInfo = pSVar1;
    if (pRVar2 == (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0) {
LAB_003219b5:
      NamespaceScopeManager::~NamespaceScopeManager(&local_30);
      return;
    }
    if ((DOMElement *)pRVar2->fKey == redefineElem) {
      pSVar1 = pRVar2->fData;
      if (pSVar1 != (SchemaInfo *)0x0) {
        this->fSchemaInfo = pSVar1;
        processChildren(this,pSVar1->fSchemaRootElement);
        this->fSchemaInfo = pSVar3;
        processChildren(this,redefineElem);
      }
      goto LAB_003219b5;
    }
    pRVar2 = pRVar2->fNext;
  } while( true );
}

Assistant:

void TraverseSchema::traverseRedefine(const DOMElement* const redefineElem) {

    NamespaceScopeManager nsMgr(redefineElem, fSchemaInfo, this);

    SchemaInfo* saveInfo = fSchemaInfo;
    SchemaInfo* redefinedInfo = fPreprocessedNodes->get(redefineElem);

    if (redefinedInfo) {

        // Now we have to march through our nicely-renamed schemas. When
        // we do these traversals other <redefine>'s may perhaps be
        // encountered; we leave recursion to sort this out.
        fSchemaInfo = redefinedInfo;
        processChildren(fSchemaInfo->getRoot());
        fSchemaInfo = saveInfo;

        // Now traverse our own <redefine>
        processChildren(redefineElem);
    }
}